

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::FCDUTF8CollationIterator::previousCodePoint
          (FCDUTF8CollationIterator *this,UErrorCode *errorCode)

{
  byte bVar1;
  UBool UVar2;
  uint uVar3;
  int iVar4;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  uint local_24;
  UChar32 c;
  UErrorCode *errorCode_local;
  FCDUTF8CollationIterator *this_local;
  
  do {
    while (this->state != CHECK_BWD) {
      if ((this->state == IN_FCD_SEGMENT) &&
         ((this->super_UTF8CollationIterator).pos != this->start)) {
        iVar4 = (this->super_UTF8CollationIterator).pos + -1;
        (this->super_UTF8CollationIterator).pos = iVar4;
        bVar1 = (this->super_UTF8CollationIterator).u8[iVar4];
        local_24 = (uint)bVar1;
        if ((bVar1 & 0x80) != 0) {
          local_24 = utf8_prevCharSafeBody_63
                               ((this->super_UTF8CollationIterator).u8,0,
                                &(this->super_UTF8CollationIterator).pos,local_24,-3);
        }
        return local_24;
      }
      if ((2 < (int)this->state) && ((this->super_UTF8CollationIterator).pos != 0)) {
        uVar3 = UnicodeString::char32At
                          (&this->normalized,(this->super_UTF8CollationIterator).pos + -1);
        iVar4 = 2;
        if (uVar3 < 0x10000) {
          iVar4 = 1;
        }
        (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos - iVar4;
        return uVar3;
      }
      switchToBackward(this);
    }
    if ((this->super_UTF8CollationIterator).pos == 0) {
      return -1;
    }
    bVar1 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos + -1];
    if ((bVar1 & 0x80) == 0) {
      (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + -1;
      return (uint)bVar1;
    }
    iVar4 = (this->super_UTF8CollationIterator).pos + -1;
    (this->super_UTF8CollationIterator).pos = iVar4;
    bVar1 = (this->super_UTF8CollationIterator).u8[iVar4];
    local_24 = (uint)bVar1;
    if ((bVar1 & 0x80) != 0) {
      local_24 = utf8_prevCharSafeBody_63
                           ((this->super_UTF8CollationIterator).u8,0,
                            &(this->super_UTF8CollationIterator).pos,local_24,-3);
    }
    if ((int)local_24 < 0x10000) {
      local_34 = local_24;
    }
    else {
      local_34 = ((int)local_24 >> 10) + 0xd7c0U & 0xffff;
    }
    UVar2 = CollationFCD::hasLccc(local_34);
    if ((UVar2 == '\0') ||
       ((UVar2 = CollationFCD::maybeTibetanCompositeVowel(local_24), UVar2 == '\0' &&
        (((this->super_UTF8CollationIterator).pos == 0 ||
         (UVar2 = previousHasTccc(this), UVar2 == '\0')))))) {
      return local_24;
    }
    if (local_24 < 0x80) {
      local_38 = 1;
    }
    else {
      if (local_24 < 0x800) {
        local_3c = 2;
      }
      else {
        if (local_24 < 0xd800) {
          local_40 = 3;
        }
        else {
          if ((local_24 < 0xe000) || (0x10ffff < local_24)) {
            local_44 = 0;
          }
          else {
            local_44 = 4;
            if (local_24 < 0x10000) {
              local_44 = 3;
            }
          }
          local_40 = local_44;
        }
        local_3c = local_40;
      }
      local_38 = local_3c;
    }
    (this->super_UTF8CollationIterator).pos = local_38 + (this->super_UTF8CollationIterator).pos;
    UVar2 = previousSegment(this,errorCode);
  } while (UVar2 != '\0');
  return -1;
}

Assistant:

UChar32
FCDUTF8CollationIterator::previousCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == CHECK_BWD) {
            if(pos == 0) {
                return U_SENTINEL;
            }
            if(U8_IS_SINGLE(c = u8[pos - 1])) {
                --pos;
                return c;
            }
            U8_PREV_OR_FFFD(u8, 0, pos, c);
            if(CollationFCD::hasLccc(c <= 0xffff ? c : U16_LEAD(c)) &&
                    (CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != 0 && previousHasTccc()))) {
                // c is not FCD-inert, therefore it is not U+FFFD and it has a valid byte sequence
                // and we can use U8_LENGTH() rather than a previous-position variable.
                pos += U8_LENGTH(c);
                if(!previousSegment(errorCode)) {
                    return U_SENTINEL;
                }
                continue;
            }
            return c;
        } else if(state == IN_FCD_SEGMENT && pos != start) {
            U8_PREV_OR_FFFD(u8, 0, pos, c);
            return c;
        } else if(state >= IN_NORMALIZED && pos != 0) {
            c = normalized.char32At(pos - 1);
            pos -= U16_LENGTH(c);
            return c;
        } else {
            switchToBackward();
        }
    }
}